

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fast-dtoa.cc
# Opt level: O0

void TestFastDtoaShortestVariousDoubles(void)

{
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  Vector<char> buffer_05;
  Vector<char> buffer_06;
  Vector<char> buffer_07;
  Vector<char> buffer_08;
  bool bVar1;
  double dVar2;
  uint64_t largest_denormal64;
  double v;
  uint64_t smallest_normal64;
  double max_double;
  double min_double;
  bool status;
  int point;
  int length;
  Vector<char> buffer;
  char buffer_container [100];
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  char *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  Double in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  int iVar3;
  char *in_stack_fffffffffffffed0;
  char *file;
  int *in_stack_fffffffffffffed8;
  int *decimal_point;
  Double in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  double in_stack_fffffffffffffef0;
  double v_00;
  char *in_stack_fffffffffffffef8;
  char *pcVar4;
  undefined8 in_stack_ffffffffffffff00;
  int *piVar5;
  undefined1 local_78 [16];
  char local_68 [104];
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  double_conversion::Vector<char>::Vector((Vector<char> *)local_78,local_68,100);
  buffer_00._8_8_ = in_stack_ffffffffffffff00;
  buffer_00.start_ = in_stack_fffffffffffffef8;
  double_conversion::FastDtoa
            (in_stack_fffffffffffffef0,(FastDtoaMode)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             (int)in_stack_fffffffffffffee8,buffer_00,(int *)in_stack_fffffffffffffee0.d64_,
             in_stack_fffffffffffffed8);
  CheckHelper((char *)in_stack_fffffffffffffec0.d64_,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20)
              ,in_stack_fffffffffffffeb0,SUB41((uint)in_stack_fffffffffffffeac >> 0x18,0));
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar3,(char *)in_stack_fffffffffffffec0.d64_,
                    in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                    (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar3,(char *)in_stack_fffffffffffffec0.d64_,
                    (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0,
                    in_stack_fffffffffffffeac);
  buffer_01._8_8_ = in_stack_ffffffffffffff00;
  buffer_01.start_ = in_stack_fffffffffffffef8;
  double_conversion::FastDtoa
            (in_stack_fffffffffffffef0,(FastDtoaMode)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             (int)in_stack_fffffffffffffee8,buffer_01,(int *)in_stack_fffffffffffffee0.d64_,
             in_stack_fffffffffffffed8);
  CheckHelper((char *)in_stack_fffffffffffffec0.d64_,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20)
              ,in_stack_fffffffffffffeb0,SUB41((uint)in_stack_fffffffffffffeac >> 0x18,0));
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar3,(char *)in_stack_fffffffffffffec0.d64_,
                    in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                    (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar3,(char *)in_stack_fffffffffffffec0.d64_,
                    (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0,
                    in_stack_fffffffffffffeac);
  buffer_02._8_8_ = in_stack_ffffffffffffff00;
  buffer_02.start_ = in_stack_fffffffffffffef8;
  double_conversion::FastDtoa
            (in_stack_fffffffffffffef0,(FastDtoaMode)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             (int)in_stack_fffffffffffffee8,buffer_02,(int *)in_stack_fffffffffffffee0.d64_,
             in_stack_fffffffffffffed8);
  CheckHelper((char *)in_stack_fffffffffffffec0.d64_,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20)
              ,in_stack_fffffffffffffeb0,SUB41((uint)in_stack_fffffffffffffeac >> 0x18,0));
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar3,(char *)in_stack_fffffffffffffec0.d64_,
                    in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                    (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar3,(char *)in_stack_fffffffffffffec0.d64_,
                    (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0,
                    in_stack_fffffffffffffeac);
  buffer_03._8_8_ = in_stack_ffffffffffffff00;
  buffer_03.start_ = in_stack_fffffffffffffef8;
  double_conversion::FastDtoa
            (in_stack_fffffffffffffef0,(FastDtoaMode)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             (int)in_stack_fffffffffffffee8,buffer_03,(int *)in_stack_fffffffffffffee0.d64_,
             in_stack_fffffffffffffed8);
  CheckHelper((char *)in_stack_fffffffffffffec0.d64_,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20)
              ,in_stack_fffffffffffffeb0,SUB41((uint)in_stack_fffffffffffffeac >> 0x18,0));
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar3,(char *)in_stack_fffffffffffffec0.d64_,
                    in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                    (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar3,(char *)in_stack_fffffffffffffec0.d64_,
                    (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0,
                    in_stack_fffffffffffffeac);
  buffer_04._8_8_ = in_stack_ffffffffffffff00;
  buffer_04.start_ = in_stack_fffffffffffffef8;
  double_conversion::FastDtoa
            (in_stack_fffffffffffffef0,(FastDtoaMode)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             (int)in_stack_fffffffffffffee8,buffer_04,(int *)in_stack_fffffffffffffee0.d64_,
             in_stack_fffffffffffffed8);
  CheckHelper((char *)in_stack_fffffffffffffec0.d64_,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20)
              ,in_stack_fffffffffffffeb0,SUB41((uint)in_stack_fffffffffffffeac >> 0x18,0));
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar3,(char *)in_stack_fffffffffffffec0.d64_,
                    in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                    (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar3,(char *)in_stack_fffffffffffffec0.d64_,
                    (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0,
                    in_stack_fffffffffffffeac);
  buffer_05._8_8_ = in_stack_ffffffffffffff00;
  buffer_05.start_ = in_stack_fffffffffffffef8;
  double_conversion::FastDtoa
            (in_stack_fffffffffffffef0,(FastDtoaMode)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             (int)in_stack_fffffffffffffee8,buffer_05,(int *)in_stack_fffffffffffffee0.d64_,
             in_stack_fffffffffffffed8);
  CheckHelper((char *)in_stack_fffffffffffffec0.d64_,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20)
              ,in_stack_fffffffffffffeb0,SUB41((uint)in_stack_fffffffffffffeac >> 0x18,0));
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar3,(char *)in_stack_fffffffffffffec0.d64_,
                    in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                    (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  CheckEqualsHelper(in_stack_fffffffffffffed0,iVar3,(char *)in_stack_fffffffffffffec0.d64_,
                    (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0,
                    in_stack_fffffffffffffeac);
  buffer_06._8_8_ = local_78._8_8_;
  buffer_06.start_ = (char *)local_78._0_8_;
  pcVar4 = (char *)local_78._0_8_;
  piVar5 = (int *)local_78._8_8_;
  bVar1 = double_conversion::FastDtoa
                    (in_stack_fffffffffffffef0,
                     (FastDtoaMode)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                     (int)in_stack_fffffffffffffee8,buffer_06,(int *)in_stack_fffffffffffffee0.d64_,
                     in_stack_fffffffffffffed8);
  if (bVar1) {
    double_conversion::Vector<char>::start((Vector<char> *)local_78);
    CheckEqualsHelper(in_stack_fffffffffffffed0,iVar3,(char *)in_stack_fffffffffffffec0.d64_,
                      in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                      (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    CheckEqualsHelper(in_stack_fffffffffffffed0,iVar3,(char *)in_stack_fffffffffffffec0.d64_,
                      (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0,
                      in_stack_fffffffffffffeac);
  }
  v_00 = 2.2250738585072014e-308;
  double_conversion::Double::Double((Double *)&stack0xfffffffffffffee0,0x10000000000000);
  dVar2 = double_conversion::Double::value((Double *)0x862e48);
  buffer_07._8_8_ = piVar5;
  buffer_07.start_ = pcVar4;
  file = (char *)local_78._0_8_;
  decimal_point = (int *)local_78._8_8_;
  bVar1 = double_conversion::FastDtoa
                    (v_00,(FastDtoaMode)((ulong)dVar2 >> 0x20),SUB84(dVar2,0),buffer_07,
                     (int *)in_stack_fffffffffffffee0.d64_,(int *)local_78._8_8_);
  if (bVar1) {
    double_conversion::Vector<char>::start((Vector<char> *)local_78);
    CheckEqualsHelper(file,iVar3,(char *)in_stack_fffffffffffffec0.d64_,in_stack_fffffffffffffeb8,
                      in_stack_fffffffffffffeb0,
                      (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    CheckEqualsHelper(file,iVar3,(char *)in_stack_fffffffffffffec0.d64_,
                      (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0,
                      in_stack_fffffffffffffeac);
  }
  iVar3 = 0xfffff;
  double_conversion::Double::Double((Double *)&stack0xfffffffffffffec0,0xfffffffffffff);
  dVar2 = double_conversion::Double::value((Double *)0x862f2d);
  buffer_08._8_8_ = piVar5;
  buffer_08.start_ = pcVar4;
  bVar1 = double_conversion::FastDtoa
                    (v_00,(FastDtoaMode)((ulong)dVar2 >> 0x20),SUB84(dVar2,0),buffer_08,
                     (int *)in_stack_fffffffffffffee0.d64_,decimal_point);
  if (bVar1) {
    double_conversion::Vector<char>::start((Vector<char> *)local_78);
    CheckEqualsHelper(file,iVar3,(char *)in_stack_fffffffffffffec0.d64_,(char *)local_78._8_8_,
                      (char *)local_78._0_8_,
                      (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    CheckEqualsHelper(file,iVar3,(char *)in_stack_fffffffffffffec0.d64_,
                      (int)((ulong)local_78._8_8_ >> 0x20),(char *)local_78._0_8_,
                      in_stack_fffffffffffffeac);
  }
  return;
}

Assistant:

TEST(FastDtoaShortestVariousDoubles) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  int length;
  int point;
  bool status;

  double min_double = 5e-324;
  status = FastDtoa(min_double, FAST_DTOA_SHORTEST, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("5", buffer.start());
  CHECK_EQ(-323, point);

  double max_double = 1.7976931348623157e308;
  status = FastDtoa(max_double, FAST_DTOA_SHORTEST, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("17976931348623157", buffer.start());
  CHECK_EQ(309, point);

  status = FastDtoa(4294967272.0, FAST_DTOA_SHORTEST, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("4294967272", buffer.start());
  CHECK_EQ(10, point);

  status = FastDtoa(4.1855804968213567e298, FAST_DTOA_SHORTEST, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("4185580496821357", buffer.start());
  CHECK_EQ(299, point);

  status = FastDtoa(5.5626846462680035e-309, FAST_DTOA_SHORTEST, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("5562684646268003", buffer.start());
  CHECK_EQ(-308, point);

  status = FastDtoa(2147483648.0, FAST_DTOA_SHORTEST, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("2147483648", buffer.start());
  CHECK_EQ(10, point);

  status = FastDtoa(3.5844466002796428e+298, FAST_DTOA_SHORTEST, 0,
                    buffer, &length, &point);
  if (status) {  // Not all FastDtoa variants manage to compute this number.
    CHECK_EQ("35844466002796428", buffer.start());
    CHECK_EQ(299, point);
  }

  uint64_t smallest_normal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00100000, 00000000);
  double v = Double(smallest_normal64).value();
  status = FastDtoa(v, FAST_DTOA_SHORTEST, 0, buffer, &length, &point);
  if (status) {
    CHECK_EQ("22250738585072014", buffer.start());
    CHECK_EQ(-307, point);
  }

  uint64_t largest_denormal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x000FFFFF, FFFFFFFF);
  v = Double(largest_denormal64).value();
  status = FastDtoa(v, FAST_DTOA_SHORTEST, 0, buffer, &length, &point);
  if (status) {
    CHECK_EQ("2225073858507201", buffer.start());
    CHECK_EQ(-307, point);
  }
}